

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall
matchit::impl::IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::reset
          (IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this,
          int32_t depth)

{
  _Variadic_union<std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  local_38;
  undefined8 uStack_20;
  
  if (depth <= this->mDepth) {
    local_38._16_8_ = 0;
    uStack_20 = 0;
    local_38._M_rest._M_rest =
         (_Variadic_union<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
          )0x0;
    local_38._8_8_ = 0;
    std::__detail::__variant::
    _Move_assign_base<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
    ::operator=((_Move_assign_base<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
                 *)&this->mVariant,
                (_Move_assign_base<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
                 *)&local_38);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
                         *)&local_38);
    this->mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }